

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O1

wchar_t ui_entry_renderer_customize(wchar_t ind,char *colors,char *label_colors,char *symbols)

{
  int *piVar1;
  wchar_t wVar2;
  int iVar3;
  size_t sVar4;
  wchar_t *dest;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  
  wVar2 = L'\x01';
  if ((L'\0' < ind) && (ind <= renderer_count)) {
    if (colors != (char *)0x0) {
      sVar4 = strlen(colors);
      wVar2 = (wchar_t)sVar4;
      if ((ulong)(long)renderers[(uint)(ind + L'\xffffffff')].ncolors <= sVar4) {
        wVar2 = renderers[(uint)(ind + L'\xffffffff')].ncolors;
      }
      if (L'\0' < wVar2) {
        piVar1 = renderers[(uint)(ind + L'\xffffffff')].colors;
        uVar6 = 0;
        do {
          iVar3 = color_char_to_attr(colors[uVar6]);
          piVar1[uVar6] = iVar3;
          uVar6 = uVar6 + 1;
        } while ((uint)wVar2 != uVar6);
      }
    }
    if (label_colors != (char *)0x0) {
      sVar4 = strlen(label_colors);
      wVar2 = (wchar_t)sVar4;
      if ((ulong)(long)renderers[(uint)(ind + L'\xffffffff')].ncolors <= sVar4) {
        wVar2 = renderers[(uint)(ind + L'\xffffffff')].ncolors;
      }
      if (L'\0' < wVar2) {
        piVar1 = renderers[(uint)(ind + L'\xffffffff')].label_colors;
        uVar6 = 0;
        do {
          iVar3 = color_char_to_attr(label_colors[uVar6]);
          piVar1[uVar6] = iVar3;
          uVar6 = uVar6 + 1;
        } while ((uint)wVar2 != uVar6);
      }
    }
    if (symbols != (char *)0x0) {
      uVar7 = ind + L'\xffffffff';
      dest = (wchar_t *)mem_alloc((long)renderers[uVar7].nsym * 4 + 4);
      sVar5 = text_mbstowcs(dest,symbols,renderers[uVar7].nsym + L'\x01');
      if (sVar5 == 0xffffffffffffffff) {
        return L'\x01';
      }
      wVar2 = (wchar_t)sVar5;
      if (renderers[uVar7].nsym < (wchar_t)sVar5) {
        wVar2 = renderers[uVar7].nsym;
      }
      memcpy(renderers[uVar7].symbols,dest,(long)wVar2 << 2);
      mem_free(dest);
    }
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

int ui_entry_renderer_customize(int ind, const char *colors,
	const char *label_colors, const char *symbols)
{
	size_t length;

	if (ind <= 0 || ind > renderer_count) {
		return 1;
	}
	if (colors != 0) {
		length = strlen(colors);
		convert_chars_to_attrs(colors,
			(length < (size_t) renderers[ind - 1].ncolors) ?
			(int) length : renderers[ind - 1].ncolors,
			renderers[ind - 1].colors);
	}
	if (label_colors != 0) {
		length = strlen(label_colors);
		convert_chars_to_attrs(label_colors,
			(length < (size_t) renderers[ind - 1].ncolors) ?
			(int) length : renderers[ind - 1].ncolors,
			renderers[ind - 1].label_colors);
	}
	if (symbols != 0) {
		wchar_t *tmp = mem_alloc((renderers[ind - 1].nsym + 1) *
			sizeof(*tmp));

		length = text_mbstowcs(tmp, symbols,
			renderers[ind - 1].nsym + 1);
		if (length == (size_t)-1) {
			return 1;
		}
		(void) memcpy(renderers[ind - 1].symbols, tmp,
			(((int)length < renderers[ind - 1].nsym) ?
			(int)length : renderers[ind - 1].nsym) *
			sizeof(*renderers[ind - 1].symbols));
		mem_free(tmp);
	}
	return 0;
}